

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.h
# Opt level: O0

void __thiscall Simulator::push_real_array(Simulator *this,PCode *code)

{
  bool bVar1;
  string *psVar2;
  Symbol *pSVar3;
  unsigned_long __n;
  vector<double,_std::allocator<double>_> *pvVar4;
  int *piVar5;
  const_reference pvVar6;
  StackSymbol local_1c8;
  undefined1 local_180 [8];
  Symbol offset;
  undefined1 local_a0 [8];
  Symbol symbol;
  PCode *code_local;
  Simulator *this_local;
  
  symbol._128_8_ = code;
  psVar2 = PCode::first_abi_cxx11_(code);
  pSVar3 = ScopeTree::resolve(&this->tree_,psVar2);
  Symbol::Symbol((Symbol *)local_a0,pSVar3);
  psVar2 = PCode::second_abi_cxx11_((PCode *)symbol._128_8_);
  bVar1 = Recognition::is_integer(psVar2);
  if (bVar1) {
    pvVar4 = Symbol::real_array((Symbol *)local_a0);
    psVar2 = PCode::second_abi_cxx11_((PCode *)symbol._128_8_);
    __n = std::__cxx11::stoul(psVar2,(size_t *)0x0,10);
    pvVar6 = std::vector<double,_std::allocator<double>_>::at(pvVar4,__n);
    StackSymbol::StackSymbol((StackSymbol *)&offset.is_assigned_,pvVar6);
    std::deque<StackSymbol,_std::allocator<StackSymbol>_>::push_back
              (&this->stack_,(value_type *)&offset.is_assigned_);
    StackSymbol::~StackSymbol((StackSymbol *)&offset.is_assigned_);
  }
  else {
    psVar2 = PCode::second_abi_cxx11_((PCode *)symbol._128_8_);
    pSVar3 = ScopeTree::resolve(&this->tree_,psVar2);
    Symbol::Symbol((Symbol *)local_180,pSVar3);
    pvVar4 = Symbol::real_array((Symbol *)local_a0);
    piVar5 = Symbol::int_value((Symbol *)local_180);
    pvVar6 = std::vector<double,_std::allocator<double>_>::at(pvVar4,(long)*piVar5);
    StackSymbol::StackSymbol(&local_1c8,pvVar6);
    std::deque<StackSymbol,_std::allocator<StackSymbol>_>::push_back(&this->stack_,&local_1c8);
    StackSymbol::~StackSymbol(&local_1c8);
    Symbol::~Symbol((Symbol *)local_180);
  }
  inc_eip(this);
  Symbol::~Symbol((Symbol *)local_a0);
  return;
}

Assistant:

void Simulator::push_real_array(const PCode &code) {
    Symbol symbol = tree_.resolve(code.first());
    if (Recognition::is_integer(code.second())) {
        stack_.push_back(StackSymbol(symbol.real_array().at(std::stoul(code.second()))));
    } else {
        Symbol offset = tree_.resolve(code.second());
        stack_.push_back(StackSymbol(symbol.real_array().at((unsigned long)offset.int_value())));
    }
    inc_eip();
}